

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

StringEnumeration * __thiscall
icu_63::PluralRules::getKeywords(PluralRules *this,UErrorCode *status)

{
  UBool UVar1;
  PluralKeywordEnumeration *this_00;
  PluralKeywordEnumeration *local_58;
  LocalPointerBase<icu_63::StringEnumeration> local_28;
  LocalPointer<icu_63::StringEnumeration> nameEnumerator;
  UErrorCode *status_local;
  PluralRules *this_local;
  
  nameEnumerator.super_LocalPointerBase<icu_63::StringEnumeration>.ptr =
       (LocalPointerBase<icu_63::StringEnumeration>)
       (LocalPointerBase<icu_63::StringEnumeration>)status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    UVar1 = ::U_FAILURE(this->mInternalStatus);
    if (UVar1 == '\0') {
      this_00 = (PluralKeywordEnumeration *)UMemory::operator_new((UMemory *)0xa0,(size_t)status);
      local_58 = (PluralKeywordEnumeration *)0x0;
      if (this_00 != (PluralKeywordEnumeration *)0x0) {
        PluralKeywordEnumeration::PluralKeywordEnumeration
                  (this_00,this->mRules,
                   (UErrorCode *)
                   nameEnumerator.super_LocalPointerBase<icu_63::StringEnumeration>.ptr);
        local_58 = this_00;
      }
      LocalPointer<icu_63::StringEnumeration>::LocalPointer
                ((LocalPointer<icu_63::StringEnumeration> *)&local_28,
                 &local_58->super_StringEnumeration,
                 (UErrorCode *)nameEnumerator.super_LocalPointerBase<icu_63::StringEnumeration>.ptr)
      ;
      UVar1 = ::U_FAILURE(*(UErrorCode *)
                           nameEnumerator.super_LocalPointerBase<icu_63::StringEnumeration>.ptr);
      if (UVar1 == '\0') {
        this_local = (PluralRules *)LocalPointerBase<icu_63::StringEnumeration>::orphan(&local_28);
      }
      else {
        this_local = (PluralRules *)0x0;
      }
      LocalPointer<icu_63::StringEnumeration>::~LocalPointer
                ((LocalPointer<icu_63::StringEnumeration> *)&local_28);
    }
    else {
      *(UErrorCode *)nameEnumerator.super_LocalPointerBase<icu_63::StringEnumeration>.ptr =
           this->mInternalStatus;
      this_local = (PluralRules *)0x0;
    }
  }
  else {
    this_local = (PluralRules *)0x0;
  }
  return (StringEnumeration *)this_local;
}

Assistant:

StringEnumeration*
PluralRules::getKeywords(UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return nullptr;
    }
    if (U_FAILURE(mInternalStatus)) {
        status = mInternalStatus;
        return nullptr;
    }
    LocalPointer<StringEnumeration> nameEnumerator(new PluralKeywordEnumeration(mRules, status), status);
    if (U_FAILURE(status)) {
        return nullptr;
    }
    return nameEnumerator.orphan();
}